

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnView::scrollContentsBy(QColumnView *this,int dx,int dy)

{
  long lVar1;
  QWidget *this_00;
  bool bVar2;
  int iVar3;
  int i;
  ulong uVar4;
  int iVar5;
  
  if ((dx != 0) &&
     (lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                        super_QWidget.field_0x8, *(long *)(lVar1 + 0x550) != 0)) {
    bVar2 = QWidget::isRightToLeft((QWidget *)this);
    iVar5 = -dx;
    if (!bVar2) {
      iVar5 = dx;
    }
    for (uVar4 = 0; uVar4 < *(ulong *)(lVar1 + 0x550); uVar4 = uVar4 + 1) {
      this_00 = *(QWidget **)(*(long *)(lVar1 + 0x548) + uVar4 * 8);
      iVar3 = QWidget::x(this_00);
      QWidget::move(this_00,iVar3 + iVar5,0);
    }
    *(int *)(lVar1 + 0x574) = *(int *)(lVar1 + 0x574) + iVar5;
    QAbstractScrollArea::scrollContentsBy((QAbstractScrollArea *)this,iVar5,dy);
    return;
  }
  return;
}

Assistant:

void QColumnView::scrollContentsBy(int dx, int dy)
{
    Q_D(QColumnView);
    if (d->columns.isEmpty() || dx == 0)
        return;

    dx = isRightToLeft() ? -dx : dx;
    for (int i = 0; i < d->columns.size(); ++i)
        d->columns.at(i)->move(d->columns.at(i)->x() + dx, 0);
    d->offset += dx;
    QAbstractItemView::scrollContentsBy(dx, dy);
}